

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFModelExport.cpp
# Opt level: O2

bool iDynTree::URDFFromModel(Model *model,string *urdf_filename,ModelExporterOptions *options)

{
  char cVar1;
  bool bVar2;
  ostream *poVar3;
  string xml_string;
  ModelExporterOptions local_278;
  ofstream ofs;
  
  std::ofstream::ofstream(&ofs,(urdf_filename->_M_dataplus)._M_p,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "[ERROR] iDynTree::URDFFromModel : error opening file ");
    poVar3 = std::operator<<(poVar3,(string *)urdf_filename);
    std::endl<char,std::char_traits<char>>(poVar3);
    bVar2 = false;
  }
  else {
    xml_string._M_dataplus._M_p = (pointer)&xml_string.field_2;
    xml_string._M_string_length = 0;
    xml_string.field_2._M_local_buf[0] = '\0';
    ModelExporterOptions::ModelExporterOptions(&local_278,options);
    bVar2 = URDFStringFromModel(model,&xml_string,&local_278);
    ModelExporterOptions::~ModelExporterOptions(&local_278);
    if (bVar2) {
      std::operator<<((ostream *)&ofs,(string *)&xml_string);
      std::ofstream::close();
    }
    std::__cxx11::string::~string((string *)&xml_string);
  }
  std::ofstream::~ofstream(&ofs);
  return bVar2;
}

Assistant:

bool URDFFromModel(const iDynTree::Model & model,
                   const std::string & urdf_filename,
                   const ModelExporterOptions options)
{
    std::ofstream ofs(urdf_filename.c_str());

    if( !ofs.is_open() )
    {
        std::cerr << "[ERROR] iDynTree::URDFFromModel : error opening file "
                  << urdf_filename << std::endl;
        return false;
    }

    std::string xml_string;
    if (!URDFStringFromModel(model, xml_string, options))
    {
        return false;
    }

    // Write string to file
    ofs << xml_string;
    ofs.close();

    return true;
}